

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_nonce_gen
              (secp256k1_context *ctx,secp256k1_musig_secnonce *secnonce,
              secp256k1_musig_pubnonce *pubnonce,uchar *session_secrand32,uchar *seckey,
              secp256k1_pubkey *pubkey,uchar *msg32,secp256k1_musig_keyagg_cache *keyagg_cache,
              uchar *extra_input32)

{
  int iVar1;
  void *in_RCX;
  void *in_RSI;
  secp256k1_context *in_RDI;
  int ret;
  secp256k1_pubkey *in_stack_00000400;
  uchar *in_stack_00000408;
  uchar *in_stack_00000410;
  secp256k1_musig_pubnonce *in_stack_00000418;
  secp256k1_musig_secnonce *in_stack_00000420;
  secp256k1_context *in_stack_00000428;
  uchar *in_stack_00000440;
  secp256k1_musig_keyagg_cache *in_stack_00000448;
  uchar *in_stack_00000450;
  secp256k1_musig_secnonce *in_stack_ffffffffffffffa8;
  secp256k1_context *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar2;
  uint local_4;
  
  uVar2 = 1;
  if (in_RDI == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/session_impl.h"
            ,0x1d8,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x84);
    if (in_RCX == (void *)0x0) {
      secp256k1_callback_call
                ((secp256k1_callback *)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
      local_4 = 0;
    }
    else {
      iVar1 = secp256k1_is_zero_array
                        ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
      uVar2 = ((iVar1 != 0 ^ 0xffU) & 1) & uVar2;
      secp256k1_declassify(in_RDI,&stack0xffffffffffffffc4,4);
      if (uVar2 == 0) {
        secp256k1_musig_secnonce_invalidate(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0);
        local_4 = 0;
      }
      else {
        local_4 = secp256k1_musig_nonce_gen_internal
                            (in_stack_00000428,in_stack_00000420,in_stack_00000418,in_stack_00000410
                             ,in_stack_00000408,in_stack_00000400,in_stack_00000440,
                             in_stack_00000448,in_stack_00000450);
        local_4 = local_4 & uVar2;
        secp256k1_memczero(in_RCX,0x20,local_4);
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_musig_nonce_gen(const secp256k1_context* ctx, secp256k1_musig_secnonce *secnonce, secp256k1_musig_pubnonce *pubnonce, unsigned char *session_secrand32, const unsigned char *seckey, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache, const unsigned char *extra_input32) {
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secnonce != NULL);
    memset(secnonce, 0, sizeof(*secnonce));
    ARG_CHECK(session_secrand32 != NULL);

    /* Check in constant time that the session_secrand32 is not 0 as a
     * defense-in-depth measure that may protect against a faulty RNG. */
    ret &= !secp256k1_is_zero_array(session_secrand32, 32);

    /* We can declassify because branching on ret is only relevant when this
     * function called with an invalid session_secrand32 argument */
    secp256k1_declassify(ctx, &ret, sizeof(ret));
    if (ret == 0) {
        secp256k1_musig_secnonce_invalidate(ctx, secnonce, 1);
        return 0;
    }

    ret &= secp256k1_musig_nonce_gen_internal(ctx, secnonce, pubnonce, session_secrand32, seckey, pubkey, msg32, keyagg_cache, extra_input32);

    /* Set the session_secrand32 buffer to zero to prevent the caller from using
     * nonce_gen multiple times with the same buffer. */
    secp256k1_memczero(session_secrand32, 32, ret);
    return ret;
}